

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O2

void ssh1_channel_check_close(ssh1_channel *c)

{
  ssh1_connection_state *psVar1;
  _Bool _Var2;
  PktOut *pPVar3;
  uint uVar4;
  
  if (c->halfopen != false) {
    return;
  }
  psVar1 = c->connlayer;
  uVar4 = c->closes;
  if ((~uVar4 & 5) != 0) {
    _Var2 = (*c->chan->vt->want_close)(c->chan,(_Bool)((byte)uVar4 & 1),SUB41((uVar4 & 4) >> 2,0));
    uVar4 = c->closes;
    if (!_Var2) goto LAB_0011e312;
  }
  if ((uVar4 & 2) == 0) {
    if ((uVar4 & 1) == 0) {
      pPVar3 = (*((psVar1->ppl).bpp)->vt->new_pktout)(0x18);
      BinarySink_put_uint32(pPVar3->binarysink_,(ulong)c->remoteid);
      pq_base_push(&((psVar1->ppl).out_pq)->pqb,&pPVar3->qnode);
      uVar4 = c->closes | 1;
      c->closes = uVar4;
    }
    if ((uVar4 & 4) != 0) {
      pPVar3 = (*((psVar1->ppl).bpp)->vt->new_pktout)(0x19);
      BinarySink_put_uint32(pPVar3->binarysink_,(ulong)c->remoteid);
      pq_base_push(&((psVar1->ppl).out_pq)->pqb,&pPVar3->qnode);
      uVar4 = c->closes | 2;
      c->closes = uVar4;
    }
  }
LAB_0011e312:
  if ((~uVar4 & 10) != 0) {
    return;
  }
  psVar1 = c->connlayer;
  ssh1_channel_close_local(c,(char *)0x0);
  del234(psVar1->channels,c);
  ssh1_channel_free(c);
  queue_toplevel_callback(ssh1_check_termination_callback,psVar1);
  return;
}

Assistant:

static void ssh1_channel_check_close(struct ssh1_channel *c)
{
    struct ssh1_connection_state *s = c->connlayer;
    PktOut *pktout;

    if (c->halfopen) {
        /*
         * If we've sent out our own CHANNEL_OPEN but not yet seen
         * either OPEN_CONFIRMATION or OPEN_FAILURE in response, then
         * it's too early to be sending close messages of any kind.
         */
        return;
    }

    if ((!((CLOSES_SENT_CLOSE | CLOSES_RCVD_CLOSE) & ~c->closes) ||
         chan_want_close(c->chan, (c->closes & CLOSES_SENT_CLOSE),
                         (c->closes & CLOSES_RCVD_CLOSE))) &&
        !(c->closes & CLOSES_SENT_CLOSECONF)) {
        /*
         * We have both sent and received CLOSE (or the channel type
         * doesn't need us to), which means the channel is in final
         * wind-up. Send CLOSE and/or CLOSE_CONFIRMATION, whichever we
         * haven't sent yet.
         */
        if (!(c->closes & CLOSES_SENT_CLOSE)) {
            pktout = ssh_bpp_new_pktout(s->ppl.bpp, SSH1_MSG_CHANNEL_CLOSE);
            put_uint32(pktout, c->remoteid);
            pq_push(s->ppl.out_pq, pktout);
            c->closes |= CLOSES_SENT_CLOSE;
        }
        if (c->closes & CLOSES_RCVD_CLOSE) {
            pktout = ssh_bpp_new_pktout(
                s->ppl.bpp, SSH1_MSG_CHANNEL_CLOSE_CONFIRMATION);
            put_uint32(pktout, c->remoteid);
            pq_push(s->ppl.out_pq, pktout);
            c->closes |= CLOSES_SENT_CLOSECONF;
        }
    }

    if (!((CLOSES_SENT_CLOSECONF | CLOSES_RCVD_CLOSECONF) & ~c->closes)) {
        /*
         * We have both sent and received CLOSE_CONFIRMATION, which
         * means we're completely done with the channel.
         */
        ssh1_channel_destroy(c);
    }
}